

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall Parser::checkMacroDefinition(Parser *this)

{
  bool bVar1;
  Identifier *pIVar2;
  Token *pTVar3;
  reference pvVar4;
  size_type sVar5;
  Tokenizer *pTVar6;
  mapped_type *this_00;
  vector<Token,_std::allocator<Token>_> local_188;
  iterator local_170;
  iterator local_168;
  TokenizerPosition end;
  _Self local_158;
  string_view local_150;
  Token *local_140;
  Token *tok;
  iterator iStack_130;
  bool valid;
  TokenizerPosition start;
  Identifier name;
  size_t i;
  ParserMacro macro;
  undefined1 local_68 [8];
  vector<Expression,_std::allocator<Expression>_> parameters;
  Token *token;
  Identifier *local_28;
  Identifier *identifier;
  Token *first;
  Parser *this_local;
  
  first = (Token *)this;
  identifier = (Identifier *)peekToken(this,0);
  if (((Token *)identifier)->type == Identifier) {
    local_28 = Token::identifierValue((Token *)identifier);
    bVar1 = Identifier::startsWith(local_28,'.');
    if (bVar1) {
      pIVar2 = Token::identifierValue((Token *)identifier);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&token,".macro");
      bVar1 = Identifier::operator!=(pIVar2,_token);
      if (!bVar1) {
        eatToken(this);
        if ((this->initializingMacro & 1U) == 0) {
          std::vector<Expression,_std::allocator<Expression>_>::vector
                    ((vector<Expression,_std::allocator<Expression>_> *)local_68);
          bVar1 = parseExpressionList(this,(vector<Expression,_std::allocator<Expression>_> *)
                                           local_68,1,-1);
          if (bVar1) {
            ParserMacro::ParserMacro((ParserMacro *)&i);
            macro.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pvVar4 = std::vector<Expression,_std::allocator<Expression>_>::operator[]
                               ((vector<Expression,_std::allocator<Expression>_> *)local_68,0);
            bVar1 = Expression::evaluateIdentifier(pvVar4,(Identifier *)&i);
            if (bVar1) {
              for (name._name.field_2._8_8_ = 1;
                  sVar5 = std::vector<Expression,_std::allocator<Expression>_>::size
                                    ((vector<Expression,_std::allocator<Expression>_> *)local_68),
                  (ulong)name._name.field_2._8_8_ < sVar5;
                  name._name.field_2._8_8_ = name._name.field_2._8_8_ + 1) {
                Identifier::Identifier((Identifier *)&start);
                pvVar4 = std::vector<Expression,_std::allocator<Expression>_>::operator[]
                                   ((vector<Expression,_std::allocator<Expression>_> *)local_68,
                                    name._name.field_2._8_8_);
                bVar1 = Expression::evaluateIdentifier(pvVar4,(Identifier *)&start);
                if (bVar1) {
                  std::vector<Identifier,_std::allocator<Identifier>_>::push_back
                            ((vector<Identifier,_std::allocator<Identifier>_> *)
                             ((long)&macro.name._name.field_2 + 8),(value_type *)&start);
                }
                else {
                  this_local._7_1_ = 0;
                }
                macro.counter._1_3_ = 0;
                macro.counter._0_1_ = !bVar1;
                Identifier::~Identifier((Identifier *)&start);
                if ((uint)macro.counter != 0) goto LAB_00182426;
              }
              pTVar3 = nextToken(this);
              if (pTVar3->type == Separator) {
                pTVar6 = getTokenizer(this);
                iStack_130._M_node = (_List_node_base *)Tokenizer::getPosition(pTVar6);
                tok._7_1_ = 0;
                do {
                  do {
                    bVar1 = atEnd(this);
                    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_00182189;
                    local_140 = nextToken(this);
                  } while (local_140->type != Identifier);
                  pIVar2 = Token::identifierValue(local_140);
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (&local_150,".endmacro");
                  bVar1 = Identifier::operator==(pIVar2,local_150);
                } while (!bVar1);
                tok._7_1_ = 1;
LAB_00182189:
                bVar1 = isInsideUnknownBlock(this);
                if (bVar1) {
                  printError<>(this,(Token *)identifier,
                               "Macro definition not allowed inside of block with non-trivial condition"
                              );
                  this_local._7_1_ = 0;
                  macro.counter._0_4_ = 1;
                }
                else {
                  bVar1 = isInsideTrueBlock(this);
                  if (bVar1) {
                    local_158._M_node =
                         (_Base_ptr)
                         std::
                         map<Identifier,_ParserMacro,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ParserMacro>_>_>
                         ::find(&this->macros,(key_type *)&i);
                    end.it._M_node =
                         (iterator)
                         std::
                         map<Identifier,_ParserMacro,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ParserMacro>_>_>
                         ::end(&this->macros);
                    bVar1 = std::operator!=(&local_158,(_Self *)&end);
                    if (bVar1) {
                      printError<Identifier>
                                (this,(Token *)identifier,"Macro \"%s\" already defined",
                                 (Identifier *)&i);
                      this_local._7_1_ = 0;
                      macro.counter._0_4_ = 1;
                    }
                    else if ((tok._7_1_ & 1) == 0) {
                      printError<Identifier>
                                (this,(Token *)identifier,"Macro \"%s\" not terminated",
                                 (Identifier *)&i);
                      this_local._7_1_ = 1;
                      macro.counter._0_4_ = 1;
                    }
                    else {
                      pTVar6 = getTokenizer(this);
                      local_170._M_node = (_List_node_base *)Tokenizer::getPosition(pTVar6);
                      local_168._M_node =
                           (_List_node_base *)
                           TokenizerPosition::previous((TokenizerPosition *)&local_170);
                      pTVar6 = getTokenizer(this);
                      Tokenizer::getTokens
                                (&local_188,pTVar6,(TokenizerPosition)iStack_130._M_node,
                                 (TokenizerPosition)local_168._M_node);
                      std::vector<Token,_std::allocator<Token>_>::operator=
                                ((vector<Token,_std::allocator<Token>_> *)
                                 &macro.labels._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 &local_188);
                      std::vector<Token,_std::allocator<Token>_>::~vector(&local_188);
                      pTVar3 = nextToken(this);
                      if (pTVar3->type == Separator) {
                        this_00 = std::
                                  map<Identifier,_ParserMacro,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ParserMacro>_>_>
                                  ::operator[](&this->macros,(key_type *)&i);
                        ParserMacro::operator=(this_00,(ParserMacro *)&i);
                        this_local._7_1_ = 1;
                        macro.counter._0_4_ = 1;
                      }
                      else {
                        printError<>(this,(Token *)identifier,"Endmacro directive not terminated");
                        this_local._7_1_ = 0;
                        macro.counter._0_4_ = 1;
                      }
                    }
                  }
                  else {
                    this_local._7_1_ = 1;
                    macro.counter._0_4_ = 1;
                  }
                }
              }
              else {
                printError<>(this,(Token *)identifier,"Macro directive not terminated");
                this_local._7_1_ = 0;
                macro.counter._0_4_ = 1;
              }
            }
            else {
              this_local._7_1_ = 0;
              macro.counter._0_4_ = 1;
            }
LAB_00182426:
            ParserMacro::~ParserMacro((ParserMacro *)&i);
          }
          else {
            this_local._7_1_ = 0;
            macro.counter._0_4_ = 1;
          }
          std::vector<Expression,_std::allocator<Expression>_>::~vector
                    ((vector<Expression,_std::allocator<Expression>_> *)local_68);
        }
        else {
          printError<>(this,(Token *)identifier,"Nested macro definitions not allowed");
          do {
            do {
              bVar1 = atEnd(this);
              if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_00181e7c;
              pTVar3 = nextToken(this);
            } while (pTVar3->type != Identifier);
            pIVar2 = Token::identifierValue(pTVar3);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       &parameters.super__Vector_base<Expression,_std::allocator<Expression>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,".endmacro");
            bVar1 = Identifier::operator==(pIVar2,stack0xffffffffffffffb0);
          } while (!bVar1);
LAB_00181e7c:
          this_local._7_1_ = 1;
        }
        goto LAB_00182458;
      }
    }
    this_local._7_1_ = 0;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_00182458:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::checkMacroDefinition()
{
	const Token& first = peekToken();
	if (first.type != TokenType::Identifier)
		return false;

	const auto &identifier = first.identifierValue();
	if (!identifier.startsWith('.') || first.identifierValue() != ".macro")
		return false;

	eatToken();

	// nested macro definitions are not allowed
	if (initializingMacro)
	{
		printError(first, "Nested macro definitions not allowed");
		while (!atEnd())
		{
			const Token& token = nextToken();
			if (token.type == TokenType::Identifier && token.identifierValue() == ".endmacro")
				break;
		}

		return true;
	}

	std::vector<Expression> parameters;
	if (!parseExpressionList(parameters,1,-1))
		return false;

	ParserMacro macro;
	macro.counter = 0;

	// load name
	if (!parameters[0].evaluateIdentifier(macro.name))
		return false;

	// load parameters
	for (size_t i = 1; i < parameters.size(); i++)
	{
		Identifier name;
		if (!parameters[i].evaluateIdentifier(name))
			return false;

		macro.parameters.push_back(name);
	}

	if(nextToken().type != TokenType::Separator)
	{
		printError(first, "Macro directive not terminated");
		return false;
	}

	// load macro content

	TokenizerPosition start = getTokenizer()->getPosition();
	bool valid = false;
	while (!atEnd())
	{
		const Token& tok = nextToken();
		if (tok.type == TokenType::Identifier && tok.identifierValue() == ".endmacro")
		{
			valid = true;
			break;
		}
	}

	// Macros have to be defined at parse time, so they can't be defined in blocks
	// with non-trivial conditions
	if (isInsideUnknownBlock())
	{
		printError(first, "Macro definition not allowed inside of block with non-trivial condition");
		return false;
	}

	// if we are in a known false block, don't define the macro
	if (!isInsideTrueBlock())
		return true;
	
	// duplicate check
	if (macros.find(macro.name) != macros.end())
	{
		printError(first, "Macro \"%s\" already defined", macro.name);
		return false;
	}

	// no .endmacro, not valid
	if (!valid)
	{
		printError(first, "Macro \"%s\" not terminated", macro.name);
		return true;
	}

	// get content
	TokenizerPosition end = getTokenizer()->getPosition().previous();
	macro.content = getTokenizer()->getTokens(start,end);

	if(nextToken().type != TokenType::Separator)
	{
		printError(first, "Endmacro directive not terminated");
		return false;
	}

	macros[macro.name] = macro;
	return true;
}